

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi13.hpp
# Opt level: O3

error_code __thiscall
websocketpp::processor::hybi13<websocketpp::config::asio>::prepare_pong
          (hybi13<websocketpp::config::asio> *this,string *in,message_ptr *out)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  error_code eVar2;
  message_ptr local_28;
  
  local_28.
  super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (out->
            super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_28.
  super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (out->
       super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  p_Var1 = (out->
           super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  eVar2 = prepare_control(this,PONG,in,&local_28);
  if (local_28.
      super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.
               super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  eVar2._4_4_ = 0;
  return eVar2;
}

Assistant:

lib::error_code prepare_pong(std::string const & in, message_ptr out) const {
        return this->prepare_control(frame::opcode::PONG,in,out);
    }